

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FormatterATT.c
# Opt level: O1

ZyanStatus
ZydisFormatterATTPrintDISP
          (ZydisFormatter *formatter,ZydisFormatterBuffer *buffer,ZydisFormatterContext *context)

{
  ZyanBool uppercase;
  ZyanBool force_leading_number;
  ZyanStringView *pZVar1;
  ZyanUSize ZVar2;
  ulong uVar3;
  ZyanUSize ZVar4;
  void *pvVar5;
  ZydisPadding ZVar6;
  ZyanStatus ZVar7;
  ZyanStringView *pZVar8;
  ZyanStatus unaff_EBX;
  ZyanU64 ZVar9;
  bool bVar10;
  
  if (formatter == (ZydisFormatter *)0x0) {
    __assert_fail("formatter",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x180,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (buffer == (ZydisFormatterBuffer *)0x0) {
    __assert_fail("buffer",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x181,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if (context == (ZydisFormatterContext *)0x0) {
    __assert_fail("context",
                  "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/src/FormatterATT.c"
                  ,0x182,
                  "ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter *, ZydisFormatterBuffer *, ZydisFormatterContext *)"
                 );
  }
  if ((buffer->is_token_list != '\0') &&
     (unaff_EBX = ZydisFormatterBufferAppend(buffer,'\n'), (int)unaff_EBX < 0)) {
    return unaff_EBX;
  }
  if (ZYDIS_SIGNEDNESS_SIGNED < formatter->disp_signedness) {
    if (formatter->disp_signedness != ZYDIS_SIGNEDNESS_MAX_VALUE) {
      return 0x80100004;
    }
    if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
      ZVar7 = ZydisStringAppendHexU
                        (&buffer->string,(context->operand->field_10).mem.disp.value,
                         (char)formatter->disp_padding,formatter->hex_force_leading_number,
                         formatter->hex_uppercase,formatter->number_format[1][0].string,
                         formatter->number_format[1][1].string);
    }
    else {
      if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
        return 0x80100004;
      }
      ZVar7 = ZydisStringAppendDecU
                        (&buffer->string,(context->operand->field_10).mem.disp.value,
                         (char)formatter->disp_padding,formatter->number_format[0][0].string,
                         formatter->number_format[0][1].string);
    }
    bVar10 = (int)ZVar7 < 0;
    if (bVar10) {
      unaff_EBX = ZVar7;
    }
    goto LAB_0011dce5;
  }
  if (formatter->disp_base == ZYDIS_NUMERIC_BASE_HEX) {
    ZVar9 = (context->operand->field_10).mem.disp.value;
    ZVar6 = formatter->disp_padding;
    uppercase = formatter->hex_uppercase;
    force_leading_number = formatter->hex_force_leading_number;
    pZVar8 = formatter->number_format[1][0].string;
    pZVar1 = formatter->number_format[1][1].string;
    if ((long)ZVar9 < 0) {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_0011dfb7;
      ZVar2 = (buffer->string).vector.size;
      if (ZVar2 == 0) goto LAB_0011dfd6;
      uVar3 = (buffer->string).vector.capacity;
      ZVar7 = 0x80100009;
      if (ZVar2 + 1 <= uVar3) {
        *(undefined2 *)((long)(buffer->string).vector.data + (ZVar2 - 1)) = 0x2d;
        ZVar4 = (buffer->string).vector.size;
        pvVar5 = (buffer->string).vector.data;
        (buffer->string).vector.size = ZVar4 + 1;
        ZVar7 = 0x100000;
        if (*(char *)((long)pvVar5 + ZVar4) != '\0') goto LAB_0011e014;
      }
      if (uVar3 < ZVar2 + 1) goto LAB_0011dca6;
      if (pZVar8 != (ZyanStringView *)0x0) {
        if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) goto LAB_0011e033;
        ZVar2 = (buffer->string).vector.size;
        if ((ZVar2 == 0) || (ZVar4 = (pZVar8->string).vector.size, ZVar4 == 0)) goto LAB_0011dff5;
        ZVar7 = 0x80100009;
        if ((buffer->string).vector.capacity < (ZVar2 + ZVar4) - 1) goto LAB_0011dca6;
        memcpy((void *)((long)(buffer->string).vector.data + (ZVar2 - 1)),
               (pZVar8->string).vector.data,ZVar4 - 1);
        ZVar2 = (pZVar8->string).vector.size;
        ZVar4 = (buffer->string).vector.size;
        pvVar5 = (buffer->string).vector.data;
        (buffer->string).vector.size = (ZVar2 - 1) + ZVar4;
        *(undefined1 *)((long)pvVar5 + ZVar2 + ZVar4 + -2) = 0;
      }
      ZVar9 = -ZVar9;
      pZVar8 = (ZyanStringView *)0x0;
    }
    ZVar7 = ZydisStringAppendHexU
                      (&buffer->string,ZVar9,(char)ZVar6,force_leading_number,uppercase,pZVar8,
                       pZVar1);
  }
  else {
    if (formatter->disp_base != ZYDIS_NUMERIC_BASE_DEC) {
      return 0x80100004;
    }
    ZVar9 = (context->operand->field_10).mem.disp.value;
    ZVar6 = formatter->disp_padding;
    pZVar8 = formatter->number_format[0][0].string;
    pZVar1 = formatter->number_format[0][1].string;
    if ((long)ZVar9 < 0) {
      if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_0011dfb7:
        __assert_fail("!destination->vector.allocator",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xeb,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      ZVar2 = (buffer->string).vector.size;
      if (ZVar2 == 0) {
LAB_0011dfd6:
        __assert_fail("destination->vector.size && source->size",
                      "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                      ,0xec,
                      "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)");
      }
      uVar3 = (buffer->string).vector.capacity;
      ZVar7 = 0x80100009;
      if (ZVar2 + 1 <= uVar3) {
        *(undefined2 *)((long)(buffer->string).vector.data + (ZVar2 - 1)) = 0x2d;
        ZVar4 = (buffer->string).vector.size;
        pvVar5 = (buffer->string).vector.data;
        (buffer->string).vector.size = ZVar4 + 1;
        ZVar7 = 0x100000;
        if (*(char *)((long)pvVar5 + ZVar4) != '\0') {
LAB_0011e014:
          __assert_fail("*(char*)((ZyanU8*)(destination)->vector.data + (destination)->vector.size - 1) == \'\\0\'"
                        ,
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0xf7,
                        "ZyanStatus ZydisStringAppendShort(ZyanString *, const ZydisShortString *)")
          ;
        }
      }
      if (uVar3 < ZVar2 + 1) goto LAB_0011dca6;
      if (pZVar8 != (ZyanStringView *)0x0) {
        if ((buffer->string).vector.allocator != (ZyanAllocator *)0x0) {
LAB_0011e033:
          __assert_fail("!destination->vector.allocator",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0x87,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
        }
        ZVar2 = (buffer->string).vector.size;
        if ((ZVar2 == 0) || (ZVar4 = (pZVar8->string).vector.size, ZVar4 == 0)) {
LAB_0011dff5:
          __assert_fail("destination->vector.size && source->string.vector.size",
                        "/workspace/llm4binary/github/license_c_cmakelists/zyantific[P]zydis/include/Zydis/Internal/String.h"
                        ,0x88,"ZyanStatus ZydisStringAppend(ZyanString *, const ZyanStringView *)");
        }
        ZVar7 = 0x80100009;
        if ((buffer->string).vector.capacity < (ZVar2 + ZVar4) - 1) goto LAB_0011dca6;
        memcpy((void *)((long)(buffer->string).vector.data + (ZVar2 - 1)),
               (pZVar8->string).vector.data,ZVar4 - 1);
        ZVar2 = (pZVar8->string).vector.size;
        ZVar4 = (buffer->string).vector.size;
        pvVar5 = (buffer->string).vector.data;
        (buffer->string).vector.size = (ZVar2 - 1) + ZVar4;
        *(undefined1 *)((long)pvVar5 + ZVar2 + ZVar4 + -2) = 0;
      }
      ZVar9 = -ZVar9;
      pZVar8 = (ZyanStringView *)0x0;
    }
    ZVar7 = ZydisStringAppendDecU(&buffer->string,ZVar9,(char)ZVar6,pZVar8,pZVar1);
  }
LAB_0011dca6:
  bVar10 = (int)ZVar7 < 0;
  if (bVar10) {
    unaff_EBX = ZVar7;
  }
LAB_0011dce5:
  if (!bVar10) {
    unaff_EBX = 0x100000;
  }
  return unaff_EBX;
}

Assistant:

ZyanStatus ZydisFormatterATTPrintDISP(const ZydisFormatter* formatter,
    ZydisFormatterBuffer* buffer, ZydisFormatterContext* context)
{
    ZYAN_ASSERT(formatter);
    ZYAN_ASSERT(buffer);
    ZYAN_ASSERT(context);

    ZYDIS_BUFFER_APPEND_TOKEN(buffer, ZYDIS_TOKEN_DISPLACEMENT);
    switch (formatter->disp_signedness)
    {
    case ZYDIS_SIGNEDNESS_AUTO:
    case ZYDIS_SIGNEDNESS_SIGNED:
        ZYDIS_STRING_APPEND_NUM_S(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding, 
            formatter->hex_force_leading_number, ZYAN_FALSE);
        break;
    case ZYDIS_SIGNEDNESS_UNSIGNED:
        ZYDIS_STRING_APPEND_NUM_U(formatter, formatter->disp_base, &buffer->string,
            context->operand->mem.disp.value, formatter->disp_padding, 
            formatter->hex_force_leading_number);
        break;
    default:
        return ZYAN_STATUS_INVALID_ARGUMENT;
    }

    return ZYAN_STATUS_SUCCESS;
}